

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O2

void SstFFSMarshal(SstStream Stream,void *Variable,char *Name,int Type,size_t ElemSize,
                  size_t DimCount,size_t *Shape,size_t *Count,size_t *Offsets,void *Data)

{
  long lVar1;
  FMFieldList *FieldP;
  uint *CountP;
  long *plVar2;
  int iVar3;
  FFSMetadataInfoStruct *MBase;
  uint uVar4;
  uint uVar5;
  int iVar6;
  void *pvVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  char *Name_00;
  char *Name_01;
  char *__s;
  char *__s_00;
  size_t *psVar11;
  size_t *psVar12;
  size_t sVar13;
  long lVar14;
  ulong uVar15;
  uint *puVar16;
  void *pvVar17;
  
  puVar16 = (uint *)Stream->WriterMarshalData;
  if (puVar16 == (uint *)0x0) {
    InitMarshalData(Stream);
    puVar16 = (uint *)Stream->WriterMarshalData;
    uVar5 = *puVar16;
LAB_006c5a0a:
    pvVar7 = realloc(*(void **)(puVar16 + 2),(long)(int)(uVar5 + 1) * 0x28);
    *(void **)(puVar16 + 2) = pvVar7;
    uVar5 = *puVar16;
    lVar14 = (long)(int)uVar5 * 0x28;
    pvVar17 = (void *)((long)pvVar7 + lVar14);
    *(void **)((long)pvVar7 + lVar14) = Variable;
    *(uint *)((long)pvVar7 + lVar14 + 8) = uVar5;
    *(int *)((long)pvVar7 + lVar14 + 0x20) = (int)DimCount;
    *(int *)((long)pvVar7 + lVar14 + 0x24) = Type;
    if (DimCount == 0) {
      pcVar9 = ConcatName(Name,"");
      AddField((FMFieldList *)(puVar16 + 8),(int *)(puVar16 + 6),pcVar9,Type,(int)ElemSize);
      free(pcVar9);
      RecalcMarshalStorageSize(Stream);
      *(long *)((long)pvVar17 + 0x18) =
           (long)*(int *)(*(long *)(puVar16 + 8) + -4 + (long)(int)puVar16[6] * 0x18);
      *(undefined8 *)((long)pvVar17 + 0x10) = 0xffffffffffffffff;
    }
    else {
      sVar8 = strlen(Name);
      pcVar9 = (char *)malloc(sVar8 + 0x17);
      snprintf(pcVar9,sVar8 + 0x17,"SST%d_%d_",ElemSize,(ulong)(uint)Type);
      strcat(pcVar9,Name);
      sVar8 = strlen(pcVar9);
      builtin_strncpy(pcVar9 + sVar8,"Dims",5);
      sVar8 = strlen(Name);
      pcVar10 = (char *)malloc(sVar8 + 0x17);
      snprintf(pcVar10,sVar8 + 0x17,"SST%d_%d_",ElemSize,Type);
      strcat(pcVar10,Name);
      sVar8 = strlen(pcVar10);
      builtin_strncpy(pcVar10 + sVar8,"DBCount",8);
      FieldP = (FMFieldList *)(puVar16 + 8);
      CountP = puVar16 + 6;
      AddField(FieldP,(int *)CountP,pcVar9,4,8);
      free(pcVar9);
      *(long *)((long)pvVar17 + 0x18) =
           (long)*(int *)(*(long *)(puVar16 + 8) + -4 + (long)(int)puVar16[6] * 0x18);
      pcVar9 = ConcatName(Name,"Shape");
      Name_00 = ConcatName(Name,"Count");
      Name_01 = ConcatName(Name,"Offsets");
      AddField(FieldP,(int *)CountP,pcVar10,4,8);
      __s = strdup("integer");
      sVar8 = strlen(__s);
      __s_00 = (char *)malloc(sVar8 + 0x10);
      snprintf(__s_00,sVar8 + 0x10,"*(%s[%d])",__s,DimCount);
      free(__s);
      AddSimpleField(FieldP,(int *)CountP,pcVar9,__s_00,8);
      free(__s_00);
      *(undefined4 *)(*(long *)(puVar16 + 8) + -8 + (long)(int)puVar16[6] * 0x18) = 8;
      AddVarArrayField(FieldP,(int *)CountP,Name_00,4,8,pcVar10);
      AddVarArrayField(FieldP,(int *)CountP,Name_01,4,8,pcVar10);
      free(pcVar10);
      free(pcVar9);
      free(Name_00);
      free(Name_01);
      RecalcMarshalStorageSize(Stream);
      pcVar9 = ConcatName(Name,"ElemCount");
      AddField((FMFieldList *)(puVar16 + 0xe),(int *)(puVar16 + 0xc),pcVar9,4,8);
      *(long *)((long)pvVar17 + 0x10) =
           (long)*(int *)(*(long *)(puVar16 + 0xe) + -4 + (long)(int)puVar16[0xc] * 0x18);
      pcVar10 = ConcatName(Name,"");
      AddVarArrayField((FMFieldList *)(puVar16 + 0xe),(int *)(puVar16 + 0xc),pcVar10,Type,
                       (int)ElemSize,pcVar9);
      free(pcVar10);
      free(pcVar9);
      RecalcMarshalStorageSize(Stream);
      puVar16[0x10] = 0;
      puVar16[0x11] = 0;
    }
    puVar16[10] = 0;
    puVar16[0xb] = 0;
    *puVar16 = *puVar16 + 1;
  }
  else {
    uVar5 = *puVar16;
    uVar4 = 0;
    if (0 < (int)uVar5) {
      uVar4 = uVar5;
    }
    lVar14 = -0x28;
    do {
      lVar1 = lVar14 + 0x28;
      if ((ulong)uVar4 * 0x28 - lVar1 == 0) goto LAB_006c5a0a;
      plVar2 = (long *)(*(long *)(puVar16 + 2) + 0x28 + lVar14);
      lVar14 = lVar1;
    } while ((void *)*plVar2 != Variable);
    pvVar17 = (void *)(*(long *)(puVar16 + 2) + lVar1);
  }
  MBase = (FFSMetadataInfoStruct *)Stream->M;
  iVar6 = FFSBitfieldTest(MBase,*(int *)((long)pvVar17 + 8));
  iVar3 = *(int *)((long)pvVar17 + 8);
  uVar15 = (ulong)(iVar3 >> 6);
  psVar11 = MBase->BitField;
  if (MBase->BitFieldCount <= uVar15) {
    psVar11 = (size_t *)realloc(psVar11,uVar15 * 8 + 8);
    MBase->BitField = psVar11;
    memset(psVar11 + MBase->BitFieldCount,0,(uVar15 - MBase->BitFieldCount) * 8 + 8);
    MBase->BitFieldCount = uVar15 + 1;
  }
  psVar11[uVar15] = psVar11[uVar15] | 1L << ((byte)iVar3 & 0x3f);
  psVar11 = (size_t *)((long)Stream->M + *(long *)((long)pvVar17 + 0x18));
  if (*(int *)((long)pvVar17 + 0x20) != 0) {
    pvVar7 = Stream->D;
    lVar14 = *(long *)((long)pvVar17 + 0x10);
    *psVar11 = DimCount;
    if (iVar6 != 0) {
      sVar13 = psVar11[1];
      psVar11[1] = sVar13 + DimCount;
      psVar12 = AppendDims((size_t *)psVar11[3],sVar13,DimCount,Count);
      psVar11[3] = (size_t)psVar12;
      if (Offsets != (size_t *)0x0) {
        psVar12 = AppendDims((size_t *)psVar11[4],sVar13,DimCount,Offsets);
        psVar11[4] = (size_t)psVar12;
      }
      sVar13 = CalcSize(DimCount,Count);
      pvVar17 = realloc(*(void **)((long)pvVar7 + lVar14 + 8),
                        (*(long *)((long)pvVar7 + lVar14) + sVar13) * ElemSize);
      *(void **)((long)pvVar7 + lVar14 + 8) = pvVar17;
      lVar1 = *(long *)((long)pvVar7 + lVar14);
      memcpy((void *)(lVar1 * ElemSize + (long)pvVar17),Data,ElemSize * sVar13);
      *(size_t *)((long)pvVar7 + lVar14) = lVar1 + sVar13;
      return;
    }
    if (Shape == (size_t *)0x0) {
      psVar12 = (size_t *)0x0;
    }
    else {
      psVar12 = CopyDims(DimCount,Shape);
    }
    psVar11[2] = (size_t)psVar12;
    psVar11[1] = DimCount;
    psVar12 = CopyDims(DimCount,Count);
    psVar11[3] = (size_t)psVar12;
    if (Offsets == (size_t *)0x0) {
      psVar12 = (size_t *)0x0;
    }
    else {
      psVar12 = CopyDims(DimCount,Offsets);
    }
    psVar11[4] = (size_t)psVar12;
    sVar13 = CalcSize(DimCount,Count);
    *(size_t *)((long)pvVar7 + lVar14) = sVar13;
    ElemSize = ElemSize * sVar13;
    psVar11 = (size_t *)malloc(ElemSize);
    *(size_t **)((long)pvVar7 + lVar14 + 8) = psVar11;
  }
  memcpy(psVar11,Data,ElemSize);
  return;
}

Assistant:

extern void SstFFSMarshal(SstStream Stream, void *Variable, const char *Name, const int Type,
                          size_t ElemSize, size_t DimCount, const size_t *Shape,
                          const size_t *Count, const size_t *Offsets, const void *Data)
{

    struct FFSMetadataInfoStruct *MBase;

    FFSWriterRec Rec = LookupWriterRec(Stream, Variable);
    if (!Rec)
    {
        Rec = CreateWriterRec(Stream, Variable, Name, Type, ElemSize, DimCount);
    }

    MBase = Stream->M;
    int AlreadyWritten = FFSBitfieldTest(MBase, Rec->FieldID);
    FFSBitfieldSet(MBase, Rec->FieldID);

    if (Rec->DimCount == 0)
    {
        memcpy((char *)(Stream->M) + Rec->MetaOffset, Data, ElemSize);
    }
    else
    {
        MetaArrayRec *MetaEntry = (MetaArrayRec *)((char *)(Stream->M) + Rec->MetaOffset);
        ArrayRec *DataEntry = (ArrayRec *)((char *)(Stream->D) + Rec->DataOffset);

        /* handle metadata */
        MetaEntry->Dims = DimCount;
        if (!AlreadyWritten)
        {
            if (Shape)
                MetaEntry->Shape = CopyDims(DimCount, Shape);
            else
                MetaEntry->Shape = NULL;
            MetaEntry->DBCount = DimCount;
            MetaEntry->Count = CopyDims(DimCount, Count);
            if (Offsets)
                MetaEntry->Offsets = CopyDims(DimCount, Offsets);
            else
                MetaEntry->Offsets = NULL;
        }
        else
        {
            /* already got some metadata, add blocks */
            size_t PreviousDBCount = MetaEntry->DBCount;
            //  Assume shape is still valid   (modify this if shape /global
            //  dimensions can change )
            // Also assume Dims is always right and consistent, otherwise, bad
            // things
            MetaEntry->DBCount += DimCount;
            MetaEntry->Count = AppendDims(MetaEntry->Count, PreviousDBCount, DimCount, Count);
            if (Offsets)
                MetaEntry->Offsets =
                    AppendDims(MetaEntry->Offsets, PreviousDBCount, DimCount, Offsets);
        }

        if ((Stream->ConfigParams->CompressionMethod == SstCompressZFP) &&
            ZFPcompressionPossible(Type, DimCount))
        {
#ifdef ADIOS2_HAVE_ZFP
            /* this should never be true if ZFP is not available */
            size_t ByteCount;
            char *Output =
                FFS_ZFPCompress(Stream, Rec->DimCount, Rec->Type, (void *)Data, Count, &ByteCount);
            DataEntry->ElemCount = ByteCount;
            DataEntry->Array = Output;
#endif
        }
        else
        {
            if (!AlreadyWritten)
            {
                /* normal array case */
                size_t ElemCount = CalcSize(DimCount, Count);
                DataEntry->ElemCount = ElemCount;
                /* this is PutSync case, so we have to copy the data NOW */
                DataEntry->Array = malloc(ElemCount * ElemSize);
                memcpy(DataEntry->Array, Data, ElemCount * ElemSize);
            }
            else
            {
                size_t ElemCount = CalcSize(DimCount, Count);
                /* this is PutSync case, so we have to copy the data NOW */
                DataEntry->Array =
                    realloc(DataEntry->Array, (DataEntry->ElemCount + ElemCount) * ElemSize);
                memcpy((char *)DataEntry->Array + DataEntry->ElemCount * ElemSize, Data,
                       ElemCount * ElemSize);
                DataEntry->ElemCount += ElemCount;
            }
        }
    }
}